

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O3

player_shape * lookup_player_shape(char *name)

{
  int iVar1;
  player_shape **pppVar2;
  
  pppVar2 = &shapes;
  do {
    pppVar2 = &((player_shape *)pppVar2)->next->next;
    if ((player_shape *)pppVar2 == (player_shape *)0x0) {
      msg("Could not find %s shape!",name);
      return (player_shape *)0x0;
    }
    iVar1 = strcmp(((player_shape *)pppVar2)->name,name);
  } while (iVar1 != 0);
  return (player_shape *)pppVar2;
}

Assistant:

struct player_shape *lookup_player_shape(const char *name)
{
	struct player_shape *shape = shapes;
	while (shape) {
		if (streq(shape->name, name)) {
			return shape;
		}
		shape = shape->next;
	}
	msg("Could not find %s shape!", name);
	return NULL;
}